

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

IStreamingReporterPtr __thiscall
Catch::ListenerRegistrar<Catch2ApprovalListener>::ListenerFactory::create
          (ListenerFactory *this,ReporterConfig *config)

{
  Catch2ApprovalListener *this_00;
  ReporterConfig *in_RDX;
  
  this_00 = (Catch2ApprovalListener *)operator_new(0x1c0);
  Catch2ApprovalListener::TestEventListenerBase(this_00,in_RDX);
  (this->super_IReporterFactory)._vptr_IReporterFactory = (_func_int **)this_00;
  return (__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
          )(__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
            )this;
}

Assistant:

IStreamingReporterPtr create( ReporterConfig const& config ) const override {
                return std::unique_ptr<T>( new T( config ) );
            }